

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O3

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::
allocator<unsigned_int>>&)::Generator::calculateFitness(wasm::CoalesceLocalsWithLearning::
pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__
          (void *this,Order *order)

{
  uint uVar1;
  double dVar2;
  ulong uVar3;
  uint *puVar4;
  undefined1 auVar5 [8];
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  undefined1 auStack_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Index removedCopies;
  
  auStack_38 = (undefined1  [8])0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CoalesceLocals::pickIndicesFromOrder
            (*this,&order->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_38,
             (Index *)((long)&indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  puVar4 = (uint *)((long)auStack_38 + 4);
  auVar5 = auStack_38;
  if (puVar4 != indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start &&
      auStack_38 !=
      (undefined1  [8])
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = *(uint *)auStack_38;
    do {
      uVar1 = *puVar4;
      bVar8 = uVar7 < uVar1;
      if (uVar7 <= uVar1) {
        uVar7 = uVar1;
      }
      if (bVar8) {
        auVar5 = (undefined1  [8])puVar4;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  uVar7 = *(uint *)(*this + 0x288);
  uVar3 = (ulong)uVar7;
  if (*(uint *)auVar5 <= uVar7) {
    dVar2 = (double)(uVar7 - *(uint *)auVar5);
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        if (uVar6 == (order->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6]) {
          dVar2 = dVar2 + 1.0 / ((double)uVar3 + (double)uVar3);
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    order->fitness =
         dVar2 * 100.0 +
         (double)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
    if (auStack_38 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_38,
                      (long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_38);
    }
    return;
  }
  __assert_fail("maxIndex <= parent->numLocals",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                ,0x282,
                "void wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<Index> &)::Generator::calculateFitness(Order *)"
               );
}

Assistant:

void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }